

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftRight(DecimalQuantity *this,int32_t numDigits)

{
  int8_t *piVar1;
  long lVar2;
  int iVar3;
  
  if (this->usingBytes == true) {
    for (lVar2 = 0; iVar3 = this->precision, lVar2 < iVar3 - numDigits; lVar2 = lVar2 + 1) {
      piVar1 = (this->fBCD).bcdBytes.ptr;
      piVar1[lVar2] = piVar1[numDigits + lVar2];
    }
    for (; lVar2 < iVar3; lVar2 = lVar2 + 1) {
      (this->fBCD).bcdBytes.ptr[lVar2] = '\0';
      iVar3 = this->precision;
    }
  }
  else {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong >> ((char)numDigits * '\x04' & 0x3fU);
    iVar3 = this->precision;
  }
  this->scale = this->scale + numDigits;
  this->precision = iVar3 - numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftRight(int32_t numDigits) {
    if (usingBytes) {
        int i = 0;
        for (; i < precision - numDigits; i++) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i + numDigits];
        }
        for (; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong >>= (numDigits * 4);
    }
    scale += numDigits;
    precision -= numDigits;
}